

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPplus(FParser *this,svalue_t *result,int start,int n,int stop)

{
  FString FVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  svalue_t right;
  svalue_t left;
  
  left.string.Chars = FString::NullString.Nothing;
  right.type = 1;
  left.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  right.string.Chars = FString::NullString.Nothing;
  right.value.i = 0;
  left.type = right.type;
  EvaluateExpression(this,&left,start,n + -1);
  EvaluateExpression(this,&right,n + 1,stop);
  FVar1 = left.string;
  if (left.type == 0) {
    if (right.type == 6) {
      floatvalue(&right);
      FString::Format(&result->string,"%s%4.4f",FVar1.Chars);
    }
    else if (right.type == 0) {
      FString::Format(&result->string,"%s%s",left.string.Chars,right.string.Chars);
    }
    else {
      uVar4 = intvalue(&right);
      FString::Format(&result->string,"%s%i",FVar1.Chars,(ulong)uVar4);
    }
    result->type = 0;
  }
  else {
    if ((left.type == 6) || (right.type == 6)) {
      result->type = 6;
      iVar2 = fixedvalue(&left);
      iVar3 = fixedvalue(&right);
    }
    else {
      result->type = 1;
      iVar2 = intvalue(&left);
      iVar3 = intvalue(&right);
    }
    (result->value).i = iVar3 + iVar2;
  }
  FString::~FString(&right.string);
  FString::~FString(&left.string);
  return;
}

Assistant:

void FParser::OPplus(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
  	if (left.type == svt_string)
    {
      	if (right.type == svt_string)
		{
			result.string.Format("%s%s", left.string.GetChars(), right.string.GetChars());
		}
      	else if (right.type == svt_fixed)
		{
			result.string.Format("%s%4.4f", left.string.GetChars(), floatvalue(right));
		}
      	else
		{
	  		result.string.Format("%s%i", left.string.GetChars(), intvalue(right));
		}
      	result.type = svt_string;
    }
	// haleyjd: 8-17
	else if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.type = svt_fixed;
		result.value.f = fixedvalue(left) + fixedvalue(right);
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) + intvalue(right);
	}
}